

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O3

char * stringcache(StringCache *cache,char *str)

{
  StringBucket **ppSVar1;
  StringBucket *pSVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  StringBucket *pSVar6;
  ulong uVar7;
  StringBucket *pSVar8;
  ulong __n;
  StringBucket *pSVar9;
  
  sVar5 = strlen(str);
  __n = sVar5 & 0xffffffff;
  if (__n == 0) {
    uVar3 = 5;
  }
  else {
    uVar3 = 0x1505;
    uVar7 = 0;
    do {
      uVar3 = (uint)(byte)str[uVar7] ^ uVar3 * 0x21;
      uVar7 = uVar7 + 1;
    } while (__n != uVar7);
    uVar3 = uVar3 & 0xff;
  }
  uVar3 = cache->table_size - 1 & uVar3;
  ppSVar1 = cache->hashtable;
  pSVar2 = ppSVar1[uVar3];
  if (pSVar2 != (StringBucket *)0x0) {
    pSVar9 = pSVar2;
    pSVar8 = (StringBucket *)0x0;
    do {
      pSVar6 = pSVar9;
      pSVar9 = (StringBucket *)pSVar6->string;
      iVar4 = strncmp((char *)pSVar9,str,__n);
      if ((iVar4 == 0) && (*(char *)((long)&pSVar9->string + __n) == '\0')) {
        if (pSVar8 == (StringBucket *)0x0) {
          return (char *)pSVar9;
        }
        if (pSVar8->next != pSVar6) {
          __assert_fail("prev->next == bucket",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/icculus[P]altrace/altrace_common.c"
                        ,0xec,
                        "const char *stringcache_len_internal(StringCache *, const char *, const unsigned int, const int)"
                       );
        }
        pSVar8->next = pSVar6->next;
        pSVar6->next = ppSVar1[uVar3];
        goto LAB_001114af;
      }
      pSVar9 = pSVar6->next;
      pSVar8 = pSVar6;
    } while (pSVar6->next != (StringBucket *)0x0);
  }
  pSVar6 = (StringBucket *)malloc(__n + 0x11);
  if (pSVar6 == (StringBucket *)0x0) {
    pSVar9 = (StringBucket *)0x0;
  }
  else {
    pSVar9 = pSVar6 + 1;
    pSVar6->string = (char *)pSVar9;
    memcpy(pSVar9,str,__n);
    *(undefined1 *)((long)&pSVar6[1].string + __n) = 0;
    pSVar6->next = pSVar2;
LAB_001114af:
    ppSVar1[uVar3] = pSVar6;
  }
  return (char *)pSVar9;
}

Assistant:

const char *stringcache(StringCache *cache, const char *str)
{
    return stringcache_len(cache, str, strlen(str));
}